

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testapi.c
# Opt level: O0

int test_list(void)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  int iVar8;
  int iVar9;
  int iVar10;
  int iVar11;
  int iVar12;
  int iVar13;
  int iVar14;
  int iVar15;
  int iVar16;
  int iVar17;
  int iVar18;
  int iVar19;
  int iVar20;
  int iVar21;
  int iVar22;
  int iVar23;
  int iVar24;
  int iVar25;
  uint uVar26;
  int test_ret;
  
  if (quiet == 0) {
    printf("Testing list : 19 of 26 functions ...\n");
  }
  iVar1 = test_xmlLinkGetData();
  iVar2 = test_xmlListAppend();
  iVar3 = test_xmlListClear();
  iVar4 = test_xmlListCopy();
  iVar5 = test_xmlListCreate();
  iVar6 = test_xmlListDup();
  iVar7 = test_xmlListEmpty();
  iVar8 = test_xmlListEnd();
  iVar9 = test_xmlListFront();
  iVar10 = test_xmlListInsert();
  iVar11 = test_xmlListMerge();
  iVar12 = test_xmlListPopBack();
  iVar13 = test_xmlListPopFront();
  iVar14 = test_xmlListPushBack();
  iVar15 = test_xmlListPushFront();
  iVar16 = test_xmlListRemoveAll();
  iVar17 = test_xmlListRemoveFirst();
  iVar18 = test_xmlListRemoveLast();
  iVar19 = test_xmlListReverse();
  iVar20 = test_xmlListReverseSearch();
  iVar21 = test_xmlListReverseWalk();
  iVar22 = test_xmlListSearch();
  iVar23 = test_xmlListSize();
  iVar24 = test_xmlListSort();
  iVar25 = test_xmlListWalk();
  uVar26 = iVar25 + iVar24 + iVar23 + iVar22 + iVar21 + iVar20 + iVar19 + iVar18 + iVar17 + iVar16 +
                                                                                            iVar15 +
                                                                                            iVar14 +
                                                                                            iVar13 +
                                                                                            iVar12 +
                                                                                            iVar11 +
                                                                                            iVar10 +
                                                                                            iVar9 + 
                                                  iVar8 + iVar7 + iVar6 + iVar5 + iVar4 + iVar3 + 
                                                  iVar2 + iVar1;
  if (uVar26 != 0) {
    printf("Module list: %d errors\n",(ulong)uVar26);
  }
  return uVar26;
}

Assistant:

static int
test_list(void) {
    int test_ret = 0;

    if (quiet == 0) printf("Testing list : 19 of 26 functions ...\n");
    test_ret += test_xmlLinkGetData();
    test_ret += test_xmlListAppend();
    test_ret += test_xmlListClear();
    test_ret += test_xmlListCopy();
    test_ret += test_xmlListCreate();
    test_ret += test_xmlListDup();
    test_ret += test_xmlListEmpty();
    test_ret += test_xmlListEnd();
    test_ret += test_xmlListFront();
    test_ret += test_xmlListInsert();
    test_ret += test_xmlListMerge();
    test_ret += test_xmlListPopBack();
    test_ret += test_xmlListPopFront();
    test_ret += test_xmlListPushBack();
    test_ret += test_xmlListPushFront();
    test_ret += test_xmlListRemoveAll();
    test_ret += test_xmlListRemoveFirst();
    test_ret += test_xmlListRemoveLast();
    test_ret += test_xmlListReverse();
    test_ret += test_xmlListReverseSearch();
    test_ret += test_xmlListReverseWalk();
    test_ret += test_xmlListSearch();
    test_ret += test_xmlListSize();
    test_ret += test_xmlListSort();
    test_ret += test_xmlListWalk();

    if (test_ret != 0)
	printf("Module list: %d errors\n", test_ret);
    return(test_ret);
}